

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionCompiler.cpp
# Opt level: O0

void __thiscall Refal2::CLeftPartCompiler::matchRightParens(CLeftPartCompiler *this)

{
  CNodeType *nodeBefore;
  CNodeType *fromNode;
  CNodeType *this_00;
  CUnitNode **ppCVar1;
  CHole local_78;
  undefined1 local_48 [8];
  CUnitList newHole;
  CUnitNode *endNew;
  CUnitNode *beginNew;
  CUnitNode *end;
  CUnitNode *begin;
  CLeftPartCompiler *this_local;
  
  COperationsBuilder::AddMatchRightParens((COperationsBuilder *)this);
  fromNode = CNodeList<Refal2::CUnit>::GetFirst((CNodeList<Refal2::CUnit> *)this->hole);
  this_00 = CNodeList<Refal2::CUnit>::GetLast((CNodeList<Refal2::CUnit> *)this->hole);
  ppCVar1 = CUnit::PairedParen(&this_00->super_CUnit);
  newHole.super_CNodeList<Refal2::CUnit>.last = CNode<Refal2::CUnit>::Prev(*ppCVar1);
  CUnitList::CUnitList((CUnitList *)local_48);
  if (newHole.super_CNodeList<Refal2::CUnit>.last != (CNodeType *)0x0) {
    CNodeList<Refal2::CUnit>::Detach
              ((CNodeList<Refal2::CUnit> *)this->hole,fromNode,
               newHole.super_CNodeList<Refal2::CUnit>.last);
    CNodeList<Refal2::CUnit>::Assign
              ((CNodeList<Refal2::CUnit> *)local_48,fromNode,
               newHole.super_CNodeList<Refal2::CUnit>.last);
  }
  CNodeList<Refal2::CUnit>::RemoveFirst((CNodeList<Refal2::CUnit> *)this->hole);
  CNodeList<Refal2::CUnit>::RemoveLast((CNodeList<Refal2::CUnit> *)this->hole);
  nodeBefore = this->hole;
  CHole::CHole(&local_78,(CUnitList *)local_48,this->top,this->top + 1);
  CNodeList<Refal2::CHole>::InsertBefore(&this->holes,nodeBefore,&local_78);
  CHole::~CHole(&local_78);
  this->top = this->top + 2;
  CUnitList::~CUnitList((CUnitList *)local_48);
  return;
}

Assistant:

void CLeftPartCompiler::matchRightParens()
{
	COperationsBuilder::AddMatchRightParens();
	
	CUnitNode* begin = hole->GetFirst();
	CUnitNode* end = hole->GetLast();
	CUnitNode* beginNew = 0;
	CUnitNode* endNew = end->PairedParen()->Prev();
	
	CUnitList newHole;
	if( endNew != 0 ) {
		beginNew = begin;
		hole->Detach( beginNew, endNew );
		newHole.Assign( beginNew, endNew );
	}
	
	hole->RemoveFirst();
	hole->RemoveLast();

	holes.InsertBefore( hole, CHole( newHole, top, top + 1 ) );
	top += 2;
}